

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IForReader.h
# Opt level: O0

void __thiscall IForReader::IForReader(IForReader *this,ifstream *ifs,ostream *os,int deep)

{
  int deep_local;
  ostream *os_local;
  ifstream *ifs_local;
  IForReader *this_local;
  
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,true);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00122c38;
  std::__cxx11::string::operator=
            ((string *)&(this->super_IAbstractReader).m_dataType,"\'For\' Block");
  return;
}

Assistant:

explicit IForReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep, true) {
        m_dataType = "\'For\' Block";
    }